

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

ggml_tensor * __thiscall
test_cross_entropy_loss_back::build_graph(test_cross_entropy_loss_back *this,ggml_context *ctx)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  undefined8 uVar4;
  undefined8 in_RSI;
  int64_t *in_RDI;
  ggml_tensor *out;
  ggml_tensor *labels;
  ggml_tensor *logits;
  ggml_tensor *grad;
  undefined8 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 uVar5;
  test_case *in_stack_ffffffffffffffd0;
  
  pgVar1 = test_case::ggml_new_tensor_1d
                     (in_stack_ffffffffffffffd0,
                      (ggml_context *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (ggml_type)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(int64_t)in_RDI);
  ggml_set_name(pgVar1,"grad");
  std::array<long,_4UL>::data((array<long,_4UL> *)0x1ac0fd);
  pgVar2 = test_case::ggml_new_tensor
                     (in_stack_ffffffffffffffd0,
                      (ggml_context *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (ggml_type)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                      (int)in_stack_ffffffffffffffc0,in_RDI);
  ggml_set_name(pgVar2,"logits");
  uVar5 = (undefined4)in_RDI[7];
  uVar4 = in_RSI;
  std::array<long,_4UL>::data((array<long,_4UL> *)0x1ac14c);
  pgVar3 = test_case::ggml_new_tensor
                     (in_stack_ffffffffffffffd0,
                      (ggml_context *)CONCAT44(uVar5,in_stack_ffffffffffffffc8),
                      (ggml_type)((ulong)uVar4 >> 0x20),(int)uVar4,in_RDI);
  ggml_set_name(pgVar3,"labels");
  uVar4 = ggml_soft_max(in_RSI,pgVar3);
  ggml_set_name(uVar4,"labels_normalized");
  pgVar1 = (ggml_tensor *)ggml_cross_entropy_loss_back(in_RSI,pgVar1,pgVar2,uVar4);
  ggml_set_name(pgVar1,"out");
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * grad = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 1);
        ggml_set_name(grad, "grad");

        ggml_tensor * logits = ggml_new_tensor(ctx, type, 4, ne.data());
        ggml_set_name(logits, "logits");

        ggml_tensor * labels = ggml_new_tensor(ctx, type, 4, ne.data());
        ggml_set_name(labels, "labels");

        // Ensure labels add up to 1:
        labels = ggml_soft_max(ctx, labels);
        ggml_set_name(labels, "labels_normalized");

        ggml_tensor * out = ggml_cross_entropy_loss_back(ctx, grad, logits, labels);
        ggml_set_name(out, "out");

        return out;
    }